

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O3

void __thiscall
polyscope::TransformationGizmo::TransformationGizmo
          (TransformationGizmo *this,string *name_,mat4 *T_,
          PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *Tpers_)

{
  pointer pcVar1;
  long lVar2;
  undefined1 auVar3 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_50;
  
  WeakReferrable::WeakReferrable((WeakReferrable *)&this->field_0x100);
  Widget::Widget(&this->super_Widget,&PTR_construction_vtable_24__005f35d0);
  (this->super_Widget)._vptr_Widget = (_func_int **)0x5f3578;
  *(undefined8 *)&this->field_0x100 = 0x5f35b8;
  *(undefined1 **)&(this->super_Widget).field_0x8 = &(this->super_Widget).field_0x18;
  pcVar1 = (name_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Widget).field_0x8,pcVar1,pcVar1 + name_->_M_string_length);
  lVar2 = *(long *)&(this->super_Widget).field_0x8;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar2,*(long *)&(this->super_Widget).field_0x10 + lVar2);
  std::__cxx11::string::append((char *)&local_50);
  PersistentValue<bool>::PersistentValue(&this->enabled,&local_50,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this->T = T_;
  this->Tpers = Tpers_;
  this->gizmoSizeRel = 0.08;
  this->diskWidthObj = 0.1;
  this->vecLength = 1.5;
  this->sphereRad = 0.32;
  (this->material)._M_dataplus._M_p = (pointer)&(this->material).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->material,"wax","");
  this->selectedDim = -1;
  this->selectedType = None;
  this->currentlyDragging = false;
  (this->dragPrevVec).field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  (this->dragPrevVec).field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  *(undefined8 *)&(this->dragPrevVec).field_2 = 0x3f53d3d400000000;
  (this->niceRGB)._M_elems[0].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3e34b4b5;
  (this->niceRGB)._M_elems[0].field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x3e78f8f9;
  (this->niceRGB)._M_elems[1].field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3e828283;
  (this->niceRGB)._M_elems[1].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3ef2f2f3;
  *(undefined8 *)&(this->niceRGB)._M_elems[1].field_2 = 0x3ebebebf3f61e1e2;
  (this->niceRGB)._M_elems[2].field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x3f2fafb0;
  (this->niceRGB)._M_elems[2].field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x3e0c8c8d;
  auVar3 = ZEXT832(0) << 0x20;
  this->ringProgram = (shared_ptr<polyscope::render::ShaderProgram>)auVar3._0_16_;
  this->arrowProgram = (shared_ptr<polyscope::render::ShaderProgram>)auVar3._16_16_;
  this->arrowProgram = (shared_ptr<polyscope::render::ShaderProgram>)auVar3._0_16_;
  this->sphereProgram = (shared_ptr<polyscope::render::ShaderProgram>)auVar3._16_16_;
  return;
}

Assistant:

TransformationGizmo::TransformationGizmo(std::string name_, glm::mat4& T_, PersistentValue<glm::mat4>* Tpers_)
    : name(name_), enabled(name + "#name", false), T(T_), Tpers(Tpers_)

{}